

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_enemy.cpp
# Opt level: O0

int AF_AActor_A_Face(VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,
                    VMReturn *ret,int numret)

{
  AActor *self_00;
  AActor *other;
  VMValue *pVVar1;
  bool bVar2;
  bool local_96;
  bool local_93;
  TAngle<double> local_90;
  TAngle<double> local_88;
  TAngle<double> local_80;
  TAngle<double> local_78;
  void *local_70;
  double z_add;
  int flags;
  DAngle pitch_offset;
  DAngle ang_offset;
  DAngle max_pitch;
  DAngle max_turn;
  AActor *faceto;
  AActor *self;
  int paramnum;
  int numret_local;
  VMReturn *ret_local;
  int numparam_local;
  TArray<VMValue,_VMValue> *defaultparam_local;
  VMValue *param_local;
  
  if (numparam < 1) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_enemy.cpp"
                  ,0xc1e,"int AF_AActor_A_Face(VMValue *, TArray<VMValue> &, int, VMReturn *, int)")
    ;
  }
  bVar2 = false;
  if (((param->field_0).field_3.Type == '\x03') &&
     (bVar2 = true, (param->field_0).field_1.atag != 1)) {
    bVar2 = (param->field_0).field_1.a == (void *)0x0;
  }
  if (!bVar2) {
    __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_enemy.cpp"
                  ,0xc1e,"int AF_AActor_A_Face(VMValue *, TArray<VMValue> &, int, VMReturn *, int)")
    ;
  }
  self_00 = (AActor *)(param->field_0).field_1.a;
  local_93 = true;
  if (self_00 != (AActor *)0x0) {
    local_93 = DObject::IsKindOf((DObject *)self_00,AActor::RegistrationInfo.MyClass);
  }
  if (local_93 == false) {
    __assert_fail("self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_enemy.cpp"
                  ,0xc1e,"int AF_AActor_A_Face(VMValue *, TArray<VMValue> &, int, VMReturn *, int)")
    ;
  }
  if (numparam < 2) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_enemy.cpp"
                  ,0xc1f,"int AF_AActor_A_Face(VMValue *, TArray<VMValue> &, int, VMReturn *, int)")
    ;
  }
  bVar2 = false;
  if ((param[1].field_0.field_3.Type == '\x03') &&
     (bVar2 = true, param[1].field_0.field_1.atag != 1)) {
    bVar2 = param[1].field_0.field_1.a == (void *)0x0;
  }
  if (bVar2) {
    other = (AActor *)param[1].field_0.field_1.a;
    local_96 = true;
    if (other != (AActor *)0x0) {
      local_96 = DObject::IsKindOf((DObject *)other,AActor::RegistrationInfo.MyClass);
    }
    if (local_96 != false) {
      TAngle<double>::TAngle(&max_pitch);
      if (numparam < 3) {
        pVVar1 = TArray<VMValue,_VMValue>::operator[](defaultparam,2);
        if ((pVVar1->field_0).field_3.Type != '\x01') {
          __assert_fail("(defaultparam[paramnum]).Type == REGT_FLOAT",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_enemy.cpp"
                        ,0xc20,
                        "int AF_AActor_A_Face(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
        }
        pVVar1 = TArray<VMValue,_VMValue>::operator[](defaultparam,2);
        TAngle<double>::operator=(&max_pitch,(pVVar1->field_0).f);
      }
      else {
        if (param[2].field_0.field_3.Type != '\x01') {
          __assert_fail("(param[paramnum]).Type == REGT_FLOAT",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_enemy.cpp"
                        ,0xc20,
                        "int AF_AActor_A_Face(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
        }
        TAngle<double>::operator=(&max_pitch,param[2].field_0.f);
      }
      TAngle<double>::TAngle(&ang_offset);
      if (numparam < 4) {
        pVVar1 = TArray<VMValue,_VMValue>::operator[](defaultparam,3);
        if ((pVVar1->field_0).field_3.Type != '\x01') {
          __assert_fail("(defaultparam[paramnum]).Type == REGT_FLOAT",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_enemy.cpp"
                        ,0xc21,
                        "int AF_AActor_A_Face(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
        }
        pVVar1 = TArray<VMValue,_VMValue>::operator[](defaultparam,3);
        TAngle<double>::operator=(&ang_offset,(pVVar1->field_0).f);
      }
      else {
        if (param[3].field_0.field_3.Type != '\x01') {
          __assert_fail("(param[paramnum]).Type == REGT_FLOAT",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_enemy.cpp"
                        ,0xc21,
                        "int AF_AActor_A_Face(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
        }
        TAngle<double>::operator=(&ang_offset,param[3].field_0.f);
      }
      TAngle<double>::TAngle(&pitch_offset);
      if (numparam < 5) {
        pVVar1 = TArray<VMValue,_VMValue>::operator[](defaultparam,4);
        if ((pVVar1->field_0).field_3.Type != '\x01') {
          __assert_fail("(defaultparam[paramnum]).Type == REGT_FLOAT",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_enemy.cpp"
                        ,0xc22,
                        "int AF_AActor_A_Face(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
        }
        pVVar1 = TArray<VMValue,_VMValue>::operator[](defaultparam,4);
        TAngle<double>::operator=(&pitch_offset,(pVVar1->field_0).f);
      }
      else {
        if (param[4].field_0.field_3.Type != '\x01') {
          __assert_fail("(param[paramnum]).Type == REGT_FLOAT",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_enemy.cpp"
                        ,0xc22,
                        "int AF_AActor_A_Face(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
        }
        TAngle<double>::operator=(&pitch_offset,param[4].field_0.f);
      }
      TAngle<double>::TAngle((TAngle<double> *)&stack0xffffffffffffffa0);
      if (numparam < 6) {
        pVVar1 = TArray<VMValue,_VMValue>::operator[](defaultparam,5);
        if ((pVVar1->field_0).field_3.Type != '\x01') {
          __assert_fail("(defaultparam[paramnum]).Type == REGT_FLOAT",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_enemy.cpp"
                        ,0xc23,
                        "int AF_AActor_A_Face(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
        }
        pVVar1 = TArray<VMValue,_VMValue>::operator[](defaultparam,5);
        TAngle<double>::operator=((TAngle<double> *)&stack0xffffffffffffffa0,(pVVar1->field_0).f);
      }
      else {
        if (param[5].field_0.field_3.Type != '\x01') {
          __assert_fail("(param[paramnum]).Type == REGT_FLOAT",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_enemy.cpp"
                        ,0xc23,
                        "int AF_AActor_A_Face(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
        }
        TAngle<double>::operator=((TAngle<double> *)&stack0xffffffffffffffa0,param[5].field_0.f);
      }
      if (numparam < 7) {
        pVVar1 = TArray<VMValue,_VMValue>::operator[](defaultparam,6);
        if ((pVVar1->field_0).field_3.Type != '\0') {
          __assert_fail("(defaultparam[paramnum]).Type == REGT_INT",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_enemy.cpp"
                        ,0xc24,
                        "int AF_AActor_A_Face(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
        }
        pVVar1 = TArray<VMValue,_VMValue>::operator[](defaultparam,6);
        z_add._4_4_ = (pVVar1->field_0).i;
      }
      else {
        if (param[6].field_0.field_3.Type != '\0') {
          __assert_fail("(param[paramnum]).Type == REGT_INT",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_enemy.cpp"
                        ,0xc24,
                        "int AF_AActor_A_Face(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
        }
        z_add._4_4_ = param[6].field_0.i;
      }
      if (numparam < 8) {
        pVVar1 = TArray<VMValue,_VMValue>::operator[](defaultparam,7);
        if ((pVVar1->field_0).field_3.Type != '\x01') {
          __assert_fail("(defaultparam[paramnum]).Type == REGT_FLOAT",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_enemy.cpp"
                        ,0xc25,
                        "int AF_AActor_A_Face(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
        }
        pVVar1 = TArray<VMValue,_VMValue>::operator[](defaultparam,7);
        local_70 = (pVVar1->field_0).field_1.a;
      }
      else {
        if (param[7].field_0.field_3.Type != '\x01') {
          __assert_fail("(param[paramnum]).Type == REGT_FLOAT",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_enemy.cpp"
                        ,0xc25,
                        "int AF_AActor_A_Face(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
        }
        local_70 = param[7].field_0.field_1.a;
      }
      TAngle<double>::TAngle(&local_78,&max_pitch);
      TAngle<double>::TAngle(&local_80,&ang_offset);
      TAngle<double>::TAngle(&local_88,&pitch_offset);
      TAngle<double>::TAngle(&local_90,(TAngle<double> *)&stack0xffffffffffffffa0);
      A_Face(self_00,other,&local_78,&local_80,&local_88,&local_90,z_add._4_4_,(double)local_70);
      return 0;
    }
    __assert_fail("faceto == NULL || faceto->IsKindOf(RUNTIME_CLASS(AActor))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_enemy.cpp"
                  ,0xc1f,"int AF_AActor_A_Face(VMValue *, TArray<VMValue> &, int, VMReturn *, int)")
    ;
  }
  __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_enemy.cpp"
                ,0xc1f,"int AF_AActor_A_Face(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_Face)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_OBJECT(faceto, AActor)
	PARAM_ANGLE_DEF(max_turn)		
	PARAM_ANGLE_DEF(max_pitch)		
	PARAM_ANGLE_DEF(ang_offset)		
	PARAM_ANGLE_DEF(pitch_offset)	
	PARAM_INT_DEF(flags)			
	PARAM_FLOAT_DEF(z_add)			

	A_Face(self, faceto, max_turn, max_pitch, ang_offset, pitch_offset, flags, z_add);
	return 0;
}